

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_TypeRules.h
# Opt level: O0

BinaryOperatorTypes *
soul::TypeRules::getTypesForEqualityOp(BinaryOperatorTypes *__return_storage_ptr__,Type *a,Type *b)

{
  bool bVar1;
  ArraySize AVar2;
  ArraySize AVar3;
  PrimitiveType local_7c;
  BinaryOperatorTypes local_78;
  undefined1 local_48 [8];
  Type operandType;
  Type *b_local;
  Type *a_local;
  
  bVar1 = Type::isStringLiteral(a);
  if ((bVar1) && (bVar1 = Type::isStringLiteral(b), bVar1)) {
    Type::Type(&__return_storage_ptr__->resultType,bool_);
    Type::Type(&__return_storage_ptr__->operandType,a);
    return __return_storage_ptr__;
  }
  bVar1 = Type::isComplex(a);
  if ((!bVar1) && (bVar1 = Type::isComplex(b), !bVar1)) {
    getTypesForComparisonOp(__return_storage_ptr__,a,b);
    return __return_storage_ptr__;
  }
  getTypesForArithmeticOp(&local_78,a,b,true);
  Type::Type((Type *)local_48,&local_78.operandType);
  BinaryOperatorTypes::~BinaryOperatorTypes(&local_78);
  bVar1 = Type::isValid((Type *)local_48);
  if (bVar1) {
    AVar2 = Type::getVectorSize(a);
    AVar3 = Type::getVectorSize(b);
    if (AVar2 == AVar3) {
      bVar1 = Type::isVector(a);
      if ((bVar1) || (bVar1 = Type::isVector(b), bVar1)) {
        PrimitiveType::PrimitiveType(&local_7c,bool_);
        AVar2 = Type::getVectorSize(a);
        Type::createVector(&__return_storage_ptr__->resultType,&local_7c,AVar2);
        Type::Type(&__return_storage_ptr__->operandType,(Type *)local_48);
      }
      else {
        Type::Type(&__return_storage_ptr__->resultType,bool_);
        Type::Type(&__return_storage_ptr__->operandType,(Type *)local_48);
      }
      goto LAB_004040d8;
    }
  }
  memset(__return_storage_ptr__,0,0x18);
  Type::Type(&__return_storage_ptr__->resultType);
  memset(&__return_storage_ptr__->operandType,0,0x18);
  Type::Type(&__return_storage_ptr__->operandType);
LAB_004040d8:
  Type::~Type((Type *)local_48);
  return __return_storage_ptr__;
}

Assistant:

static BinaryOperatorTypes getTypesForEqualityOp (const Type& a, const Type& b)
    {
        // Special case for string literals - they support ==, != but are unordered, so you can't do other comparisons
        if (a.isStringLiteral() && b.isStringLiteral())
            return { PrimitiveType::bool_, a };

        if (a.isComplex() || b.isComplex())
        {
            auto operandType = getTypesForArithmeticOp (a, b, true).operandType;

            if (operandType.isValid()
                && a.getVectorSize() == b.getVectorSize())
            {
                if (a.isVector() || b.isVector())
                    return { Type::createVector (PrimitiveType::bool_, a.getVectorSize()), operandType };

                return { PrimitiveType::bool_, operandType };
            }

            return {};
        }

        return getTypesForComparisonOp (a, b);
    }